

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_layer.h
# Opt level: O0

void __thiscall yyml::nn::DenseLayer::~DenseLayer(DenseLayer *this)

{
  DenseLayer *this_local;
  
  (this->super_LayerInterface)._vptr_LayerInterface = (_func_int **)&PTR_operator___00128bf8;
  std::__cxx11::string::~string((string *)&this->name_);
  Variable<double>::~Variable(&this->bias_);
  Variable<double>::~Variable(&this->weight_);
  return;
}

Assistant:

DenseLayer(TensorShape weight_shape, TensorShape bias_shape, std::string name)
      : weight_(weight_shape, name + "/weight"),
        bias_(bias_shape, name + "/bias"),
        name_(name) {}